

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mostream.hh
# Opt level: O2

void __thiscall OpenMesh::multiplex_streambuf::~multiplex_streambuf(multiplex_streambuf *this)

{
  ~multiplex_streambuf(this);
  operator_delete(this);
  return;
}

Assistant:

~multiplex_streambuf()
  {
    tmap_iter t_it(target_map_.begin()), t_end(target_map_.end());
    for (; t_it!=t_end; ++t_it)
      delete t_it->second;
  }